

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

TidyOptionDoc * prvTidyOptGetDocDesc(TidyOptionId optId)

{
  uint local_18;
  uint i;
  TidyOptionId optId_local;
  
  local_18 = 0;
  while( true ) {
    if (docs_xrefs[local_18].opt == N_TIDY_OPTIONS) {
      return (TidyOptionDoc *)0x0;
    }
    if (docs_xrefs[local_18].opt == optId) break;
    local_18 = local_18 + 1;
  }
  return docs_xrefs + local_18;
}

Assistant:

const TidyOptionDoc* TY_(OptGetDocDesc)( TidyOptionId optId )
{
    uint i = 0;

    while( docs_xrefs[i].opt != N_TIDY_OPTIONS )
    {
        if ( docs_xrefs[i].opt == optId )
            return &docs_xrefs[i];
        ++i;
    }
    return NULL;
}